

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

vw * setup(options_i *options)

{
  bool bVar1;
  bool bVar2;
  _Setw _Var3;
  ostream *poVar4;
  long *in_RDI;
  void *in_stack_00000080;
  trace_message_t in_stack_00000088;
  bool in_stack_00000097;
  io_buf *in_stack_00000098;
  options_i *in_stack_000000a0;
  exception *ex;
  vw *all;
  byte local_a1;
  allocator local_49;
  string local_48 [56];
  vw *local_10;
  long *local_8;
  
  local_10 = (vw *)0x0;
  local_8 = in_RDI;
  local_10 = VW::initialize(in_stack_000000a0,in_stack_00000098,in_stack_00000097,in_stack_00000088,
                            in_stack_00000080);
  local_10->vw_is_main = true;
  bVar2 = false;
  bVar1 = false;
  local_a1 = 0;
  if ((((local_10->quiet & 1U) == 0) && (local_a1 = 0, (local_10->bfgs & 1U) == 0)) &&
     (local_a1 = 0, local_10->searchstr == (void *)0x0)) {
    std::allocator<char>::allocator();
    bVar2 = true;
    std::__cxx11::string::string(local_48,"audit_regressor",&local_49);
    bVar1 = true;
    local_a1 = (**(code **)(*local_8 + 8))(local_8,local_48);
    local_a1 = local_a1 ^ 0xff;
  }
  if (bVar1) {
    std::__cxx11::string::~string(local_48);
  }
  if (bVar2) {
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
  }
  if ((local_a1 & 1) != 0) {
    poVar4 = (ostream *)std::ostream::operator<<(&local_10->trace_message,std::left);
    _Var3 = std::setw(8);
    poVar4 = std::operator<<(poVar4,_Var3);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::left);
    poVar4 = std::operator<<(poVar4,"average");
    poVar4 = std::operator<<(poVar4," ");
    _Var3 = std::setw(8);
    poVar4 = std::operator<<(poVar4,_Var3);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::left);
    poVar4 = std::operator<<(poVar4,"since");
    poVar4 = std::operator<<(poVar4," ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::right);
    _Var3 = std::setw(0xc);
    poVar4 = std::operator<<(poVar4,_Var3);
    poVar4 = std::operator<<(poVar4,"example");
    poVar4 = std::operator<<(poVar4," ");
    _Var3 = std::setw(0xe);
    poVar4 = std::operator<<(poVar4,_Var3);
    poVar4 = std::operator<<(poVar4,"example");
    poVar4 = std::operator<<(poVar4," ");
    _Var3 = std::setw(8);
    poVar4 = std::operator<<(poVar4,_Var3);
    poVar4 = std::operator<<(poVar4,"current");
    poVar4 = std::operator<<(poVar4," ");
    _Var3 = std::setw(8);
    poVar4 = std::operator<<(poVar4,_Var3);
    poVar4 = std::operator<<(poVar4,"current");
    poVar4 = std::operator<<(poVar4," ");
    _Var3 = std::setw(8);
    poVar4 = std::operator<<(poVar4,_Var3);
    poVar4 = std::operator<<(poVar4,"current");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = (ostream *)std::ostream::operator<<(&local_10->trace_message,std::left);
    _Var3 = std::setw(8);
    poVar4 = std::operator<<(poVar4,_Var3);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::left);
    poVar4 = std::operator<<(poVar4,"loss");
    poVar4 = std::operator<<(poVar4," ");
    _Var3 = std::setw(8);
    poVar4 = std::operator<<(poVar4,_Var3);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::left);
    poVar4 = std::operator<<(poVar4,"last");
    poVar4 = std::operator<<(poVar4," ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::right);
    _Var3 = std::setw(0xc);
    poVar4 = std::operator<<(poVar4,_Var3);
    poVar4 = std::operator<<(poVar4,"counter");
    poVar4 = std::operator<<(poVar4," ");
    _Var3 = std::setw(0xe);
    poVar4 = std::operator<<(poVar4,_Var3);
    poVar4 = std::operator<<(poVar4,"weight");
    poVar4 = std::operator<<(poVar4," ");
    _Var3 = std::setw(8);
    poVar4 = std::operator<<(poVar4,_Var3);
    poVar4 = std::operator<<(poVar4,"label");
    poVar4 = std::operator<<(poVar4," ");
    _Var3 = std::setw(8);
    poVar4 = std::operator<<(poVar4,_Var3);
    poVar4 = std::operator<<(poVar4,"predict");
    poVar4 = std::operator<<(poVar4," ");
    _Var3 = std::setw(8);
    poVar4 = std::operator<<(poVar4,_Var3);
    poVar4 = std::operator<<(poVar4,"features");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  return local_10;
}

Assistant:

vw* setup(options_i& options)
{
  vw* all = nullptr;
  try
  {
    all = VW::initialize(options);
  }
  catch (const exception& ex)
  {
    cout << ex.what() << endl;
    throw;
  }
  catch (...)
  {
    cout << "unknown exception" << endl;
    throw;
  }
  all->vw_is_main = true;

  if (!all->quiet && !all->bfgs && !all->searchstr && !options.was_supplied("audit_regressor"))
  {
    all->trace_message << std::left << std::setw(shared_data::col_avg_loss) << std::left << "average"
                       << " " << std::setw(shared_data::col_since_last) << std::left << "since"
                       << " " << std::right << std::setw(shared_data::col_example_counter) << "example"
                       << " " << std::setw(shared_data::col_example_weight) << "example"
                       << " " << std::setw(shared_data::col_current_label) << "current"
                       << " " << std::setw(shared_data::col_current_predict) << "current"
                       << " " << std::setw(shared_data::col_current_features) << "current" << std::endl;
    all->trace_message << std::left << std::setw(shared_data::col_avg_loss) << std::left << "loss"
                       << " " << std::setw(shared_data::col_since_last) << std::left << "last"
                       << " " << std::right << std::setw(shared_data::col_example_counter) << "counter"
                       << " " << std::setw(shared_data::col_example_weight) << "weight"
                       << " " << std::setw(shared_data::col_current_label) << "label"
                       << " " << std::setw(shared_data::col_current_predict) << "predict"
                       << " " << std::setw(shared_data::col_current_features) << "features" << std::endl;
  }

  return all;
}